

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalAssignExpression(Evaluator *this,Assign *expr,Env *env)

{
  int iVar1;
  list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  GCPtr<symbols::Object> leftValue;
  GCPtr<symbols::Object> rightValue;
  GCPtr<symbols::Object> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Eval((Evaluator *)&local_c8,&((expr->super_BinaryOp).LeftOp)->super_Node,env);
  iVar1 = (*(code *)((_List_node_base *)(local_c8.addr)->_vptr_Object)->_M_next)();
  if (iVar1 == 4) {
    plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
    do {
      plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
               (plVar2->
               super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>)
               ._M_impl._M_node.super__List_node_base._M_next;
      if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
    } while (((_List_node_base *)((long)plVar2 + 0x10))->_M_prev != (_List_node_base *)local_c8.addr
            );
    *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + -1;
    *(Object **)this = local_c8.addr;
  }
  else if (((_List_node_base *)local_c8.addr == (_List_node_base *)0x0) ||
          (plVar3 = (long *)__dynamic_cast(local_c8.addr,&symbols::Object::typeinfo,
                                           &symbols::BuiltinObject::typeinfo,0),
          plVar3 == (long *)0x0)) {
    Eval((Evaluator *)&local_c0,&((expr->super_BinaryOp).RightOp)->super_Node,env);
    iVar1 = (*(code *)**(undefined8 **)local_c0._M_dataplus._M_p)();
    if (iVar1 == 4) {
      plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      iVar1 = -1;
      do {
        plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar2->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        _Var5._M_p = local_c0._M_dataplus._M_p;
        if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while (((_List_node_base *)((long)plVar2 + 0x10))->_M_prev !=
               (_List_node_base *)local_c0._M_dataplus._M_p);
    }
    else {
      (*(((expr->super_BinaryOp).LeftOp)->super_Node)._vptr_Node[3])(&local_60);
      plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      do {
        plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 (plVar2->
                 super__List_base<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
      } while (((_List_node_base *)((long)plVar2 + 0x10))->_M_prev !=
               (_List_node_base *)local_c0._M_dataplus._M_p);
      std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::remove
                (&GCPtr<symbols::Object>::gclist_abi_cxx11_,(char *)((long)plVar2 + 0x10));
      symbols::Env::put(env,&local_60,(Object *)((_List_node_base *)((long)plVar2 + 0x10))->_M_prev)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      plVar2 = &GCPtr<symbols::Object>::gclist_abi_cxx11_;
      iVar1 = 1;
      do {
        plVar2 = (list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_> *)
                 ((_List_node_base *)plVar2)->_M_next;
        _Var5._M_p = (pointer)NATIVE_NULL.addr;
        if (plVar2 == &GCPtr<symbols::Object>::gclist_abi_cxx11_) break;
        _Var5._M_p = (pointer)NATIVE_NULL.addr;
      } while (((_List_node_base *)((long)plVar2 + 0x10))->_M_prev !=
               (_List_node_base *)NATIVE_NULL.addr);
    }
    *(int *)((long)plVar2 + 0x10U) = *(int *)((long)plVar2 + 0x10U) + iVar1;
    *(pointer *)this = _Var5._M_p;
    GCPtr<symbols::Object>::~GCPtr((GCPtr<symbols::Object> *)&local_c0);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"AssignError: ","");
    (**(code **)(*plVar3 + 0x18))(&local_40);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_40,0,0,"can\'t assign \'",0xe);
    local_c0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p == paVar6) {
      local_c0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_c0._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_c0,"\'");
    local_a0._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar6 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == paVar6) {
      local_a0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    }
    else {
      local_a0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_a0._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    newError(this,&local_80,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  GCPtr<symbols::Object>::~GCPtr(&local_c8);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalAssignExpression(Assign *expr, Env *env){
    auto leftValue = Eval(expr->LeftOp, env);
    if(isError(leftValue)){
        return leftValue;
    }
    if(auto builtin = dynamic_cast<BuiltinObject*>(leftValue.raw())){
        return newError("AssignError: ", "can't assign '" + builtin->toString() + "'");
    }
    auto rightValue = Eval(expr->RightOp, env);
    if(isError(rightValue)){
        return rightValue;
    }
    env->put(expr->LeftOp->toString(), rightValue.unref());
    return NATIVE_NULL;
}